

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLE.c
# Opt level: O2

int Sle_ManComputeDelay(Gia_Man_t *p,Vec_Int_t *vCuts)

{
  int iVar1;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar2;
  int iVar3;
  Gia_Man_t *p_01;
  int v;
  
  iVar3 = p->nObjs;
  p_00 = Vec_IntAlloc(iVar3);
  p_00->nSize = iVar3;
  if (p_00->pArray != (int *)0x0) {
    memset(p_00->pArray,0,(long)iVar3 << 2);
  }
  iVar3 = 0;
  for (v = 0; v < p->nObjs; v = v + 1) {
    p_01 = p;
    pGVar2 = Gia_ManObj(p,v);
    if ((~*(uint *)pGVar2 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar2) {
      iVar1 = Sle_ManComputeDelayOne(p_01,v,vCuts,p_00);
      if (iVar3 <= iVar1) {
        iVar3 = iVar1;
      }
    }
  }
  Vec_IntFree(p_00);
  return iVar3;
}

Assistant:

int Sle_ManComputeDelay( Gia_Man_t * p, Vec_Int_t * vCuts )
{
    int iObj, Delay, DelayMax = 0;
    Vec_Int_t * vTime = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_ManForEachAndId( p, iObj )
    {
        Delay = Sle_ManComputeDelayOne( p, iObj, vCuts, vTime );
        DelayMax = Abc_MaxInt( DelayMax, Delay );
    }
    Vec_IntFree( vTime );
    //printf( "Delay = %d.\n", DelayMax );
    return DelayMax;
}